

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

bool __thiscall mp::LinTerms::is_sorted(LinTerms *this)

{
  double dVar1;
  ptr pdVar2;
  ptr piVar3;
  size_ty sVar4;
  bool bVar5;
  
  sVar4 = (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  if (sVar4 == 0) {
    return true;
  }
  pdVar2 = (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
  dVar1 = pdVar2[sVar4 - 1];
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    return false;
  }
  piVar3 = (this->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  while( true ) {
    bVar5 = sVar4 == 1;
    if (bVar5) {
      return bVar5;
    }
    if (piVar3[sVar4 - 1] <= piVar3[sVar4 - 2]) break;
    dVar1 = pdVar2[sVar4 - 2];
    sVar4 = sVar4 - 1;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      return bVar5;
    }
  }
  return bVar5;
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }